

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O3

void __thiscall HPack::FieldLookupTable::clearDynamicTable(FieldLookupTable *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  iterator __pos;
  _Deque_base<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
  *p_Var3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  _Rb_tree<HPack::FieldLookupTable::SearchEntry,_HPack::FieldLookupTable::SearchEntry,_std::_Identity<HPack::FieldLookupTable::SearchEntry>,_std::less<HPack::FieldLookupTable::SearchEntry>,_std::allocator<HPack::FieldLookupTable::SearchEntry>_>
  ::_M_erase(&(this->searchIndex)._M_t,
             (_Link_type)(this->searchIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
  ;
  p_Var1 = &(this->searchIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->searchIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->searchIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->searchIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->searchIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->chunks).
            super__Deque_base<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
  ;
  __pos._M_cur = (p_Var3->_M_impl).super__Deque_impl_data._M_start._M_cur;
  __pos._M_first = (p_Var3->_M_impl).super__Deque_impl_data._M_start._M_first;
  __pos._M_last = (p_Var3->_M_impl).super__Deque_impl_data._M_start._M_last;
  __pos._M_node = (p_Var3->_M_impl).super__Deque_impl_data._M_start._M_node;
  std::
  deque<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
  ::_M_erase_at_end(&this->chunks,__pos);
  this->nDynamic = 0;
  this->begin = 0;
  this->end = 0;
  this->dataSize = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FieldLookupTable::clearDynamicTable()
{
    searchIndex.clear();
    chunks.clear();
    begin = 0;
    end = 0;
    nDynamic = 0;
    dataSize = 0;
}